

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O3

void blend_a64_mask_b12_sy_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  ulong uVar1;
  undefined8 uVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined1 in_XMM0 [16];
  undefined1 auVar5 [16];
  undefined2 uVar6;
  undefined2 uVar13;
  undefined2 uVar14;
  undefined2 uVar15;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar12 [16];
  undefined1 auVar16 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  auVar5 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    uVar3 = *(uint *)mask;
    uVar4 = *(undefined4 *)((long)mask + (ulong)mask_stride);
    auVar7[0] = pavgb((char)uVar4,(char)uVar3);
    auVar7[1] = pavgb((char)((uint)uVar4 >> 8),(char)(uVar3 >> 8));
    auVar7[2] = pavgb((char)((uint)uVar4 >> 0x10),(char)(uVar3 >> 0x10));
    auVar7[3] = pavgb((char)((uint)uVar4 >> 0x18),(char)(uVar3 >> 0x18));
    auVar7[4] = pavgb(0,0);
    auVar7[5] = pavgb(0,0);
    auVar7[6] = pavgb(0,0);
    auVar7[7] = pavgb(0,0);
    auVar7[8] = pavgb(0,0);
    auVar7[9] = pavgb(0,0);
    auVar7[10] = pavgb(0,0);
    auVar7[0xb] = pavgb(0,0);
    auVar7[0xc] = pavgb(0,0);
    auVar7[0xd] = pavgb(0,0);
    auVar7[0xe] = pavgb(0,0);
    auVar7[0xf] = pavgb(0,0);
    auVar7 = pmovzxbw(ZEXT416(uVar3),auVar7);
    auVar8._0_2_ = auVar7._0_2_;
    uVar1 = *(ulong *)src0;
    uVar2 = *(undefined8 *)src1;
    auVar19._8_4_ = 0;
    auVar19._0_8_ = uVar1;
    auVar19._12_2_ = (short)(uVar1 >> 0x30);
    auVar19._14_2_ = (short)((ulong)uVar2 >> 0x30);
    auVar18._12_4_ = auVar19._12_4_;
    auVar18._8_2_ = 0;
    auVar18._0_8_ = uVar1;
    auVar18._10_2_ = (short)((ulong)uVar2 >> 0x20);
    auVar17._10_6_ = auVar18._10_6_;
    auVar17._8_2_ = (short)(uVar1 >> 0x20);
    auVar17._0_8_ = uVar1;
    auVar16._8_8_ = auVar17._8_8_;
    auVar16._6_2_ = (short)((ulong)uVar2 >> 0x10);
    auVar16._4_2_ = (short)(uVar1 >> 0x10);
    auVar16._0_2_ = (undefined2)uVar1;
    auVar16._2_2_ = (short)uVar2;
    auVar11._0_12_ = auVar7._0_12_;
    auVar11._12_2_ = auVar7._6_2_;
    auVar11._14_2_ = auVar5._6_2_ - auVar7._6_2_;
    auVar10._12_4_ = auVar11._12_4_;
    auVar10._0_10_ = auVar7._0_10_;
    auVar10._10_2_ = auVar5._4_2_ - auVar7._4_2_;
    auVar9._10_6_ = auVar10._10_6_;
    auVar9._0_8_ = auVar7._0_8_;
    auVar9._8_2_ = auVar7._4_2_;
    auVar8._8_8_ = auVar9._8_8_;
    auVar8._6_2_ = auVar5._2_2_ - auVar7._2_2_;
    auVar8._4_2_ = auVar7._2_2_;
    auVar8._2_2_ = auVar5._0_2_ - auVar8._0_2_;
    auVar7 = pmaddwd(auVar8,auVar16);
    auVar12._0_4_ = auVar7._0_4_ >> 5;
    auVar12._4_4_ = auVar7._4_4_ >> 5;
    auVar12._8_4_ = auVar7._8_4_ >> 5;
    auVar12._12_4_ = auVar7._12_4_ >> 5;
    auVar7 = packssdw(auVar12,auVar12);
    uVar6 = pavgw(auVar7._0_2_,0);
    uVar13 = pavgw(auVar7._2_2_,0);
    uVar14 = pavgw(auVar7._4_2_,0);
    uVar15 = pavgw(auVar7._6_2_,0);
    pavgw(auVar7._8_2_,0);
    pavgw(auVar7._10_2_,0);
    pavgw(auVar7._12_2_,0);
    pavgw(auVar7._14_2_,0);
    *(ulong *)dst = CONCAT26(uVar15,CONCAT24(uVar14,CONCAT22(uVar13,uVar6)));
    mask = (uint8_t *)((long)mask + (ulong)(mask_stride * 2));
    src1 = src1 + src1_stride;
    src0 = (uint16_t *)((long)src0 + (ulong)src0_stride * 2);
    dst = dst + dst_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b12_sy_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;
  blend_a64_mask_bn_sy_w4_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                 src1_stride, mask, mask_stride, h,
                                 blend_4_b12);
}